

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

char Input::getChar(void)

{
  char cVar1;
  regex charRegex;
  string local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  string local_30;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"[a-z]|[A-Z]",0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Enter a valid character!","")
  ;
  regexInputValidate(&local_30,&local_50,&local_70);
  cVar1 = *local_30._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  return cVar1;
}

Assistant:

char Input::getChar() {
    regex charRegex("[a-z]|[A-Z]");
    return regexInputValidate(charRegex, "Enter a valid character!")[0];
}